

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_7.cpp
# Opt level: O0

void print_help(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Enter an expression and press \'enter\' to get a result, e.g.\n");
  poVar1 = std::operator<<(poVar1,"> 2 + 5 * (3 * 2) / 10.5 * 3.14 % 3\n");
  poVar1 = std::operator<<(poVar1,"= 4.97143\n\n");
  poVar1 = std::operator<<(poVar1,"Supported operations are: \'+\', \'-\', \'*\', \'/\', \'%\'\n\n")
  ;
  poVar1 = std::operator<<(poVar1,"\'%\' returns remainder from division, e.g. 5 % 2 = 1\n\n");
  poVar1 = std::operator<<(poVar1,
                           "Calculator supports real numbers and integers. You can input real numbers in\n"
                          );
  poVar1 = std::operator<<(poVar1,"scientific notation, e.g. 1e6, 1e-6\n\n");
  poVar1 = std::operator<<(poVar1,"It is possible to define constants to use them later.\n");
  poVar1 = std::operator<<(poVar1,"Example of definition:\n");
  poVar1 = std::operator<<(poVar1,"> const pi = 3.14\n");
  poVar1 = std::operator<<(poVar1,"To use defined constant later - type it\'s name in expression.\n"
                          );
  poVar1 = std::operator<<(poVar1,
                           "You can calculate area of circle with radius equal to 5.3 using defined constant \'pi\':\n"
                          );
  poVar1 = std::operator<<(poVar1,"> pi * 5.3 * 5.3\n");
  poVar1 = std::operator<<(poVar1,"= 88.2026\n\n");
  poVar1 = std::operator<<(poVar1,"It is possible to define variables to use them later.\n");
  poVar1 = std::operator<<(poVar1,"Example of definition:\n");
  poVar1 = std::operator<<(poVar1,"# radius = 5.3\n");
  poVar1 = std::operator<<(poVar1,"To calculate area of circle you with radius equal 5.3:\n");
  poVar1 = std::operator<<(poVar1,"> # area = pi * radius * radius\n");
  poVar1 = std::operator<<(poVar1,"= 88.2026\n\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void print_help()
{
	cout << "Enter an expression and press 'enter' to get a result, e.g.\n"
		<< "> 2 + 5 * (3 * 2) / 10.5 * 3.14 % 3\n"
		<< "= 4.97143\n\n"
		<< "Supported operations are: '+', '-', '*', '/', '%'\n\n"
		<< "'%' returns remainder from division, e.g. 5 % 2 = 1\n\n"
		<< "Calculator supports real numbers and integers. You can input real numbers in\n"
		<< "scientific notation, e.g. 1e6, 1e-6\n\n"
		<< "It is possible to define constants to use them later.\n"
		<< "Example of definition:\n"
		<< "> const pi = 3.14\n"
		<< "To use defined constant later - type it's name in expression.\n"
		<< "You can calculate area of circle with radius equal to 5.3 using defined constant 'pi':\n"
		<< "> pi * 5.3 * 5.3\n"
		<< "= 88.2026\n\n"
		<< "It is possible to define variables to use them later.\n"
		<< "Example of definition:\n"
		<< "# radius = 5.3\n"
		<< "To calculate area of circle you with radius equal 5.3:\n"
		<< "> # area = pi * radius * radius\n"
		<< "= 88.2026\n\n"
		<< endl;
}